

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O3

void duckdb::TemplatedConcatWS
               (DataChunk *args,string_t *sep_data,SelectionVector *sep_sel,SelectionVector *rsel,
               idx_t count,Vector *result)

{
  uint uVar1;
  pointer pVVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  reference this;
  reference pvVar11;
  pointer pVVar12;
  InternalException *pIVar13;
  idx_t len;
  UnifiedVectorFormat *pUVar14;
  ulong uVar15;
  pointer pVVar16;
  idx_t iVar17;
  data_ptr_t pdVar18;
  data_ptr_t pdVar19;
  ulong uVar20;
  string_t *psVar21;
  ulong uVar22;
  idx_t __n;
  data_ptr_t pdVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  size_type __n_00;
  string_t sVar27;
  size_type __dnew;
  vector<unsigned_long,_true> result_lengths;
  size_type local_128;
  data_ptr_t local_120;
  UnifiedVectorFormat *local_118;
  ulong local_110;
  UnifiedVectorFormat *local_108;
  string local_100;
  Vector *local_e0;
  SelectionVector *local_d8;
  vector<bool,_std::allocator<bool>_> local_d0;
  DataChunk *local_a8;
  string_t *local_a0;
  data_ptr_t local_98;
  ulong local_90;
  ulong local_88;
  uint local_7c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  data_ptr_t local_60;
  SelectionVector *local_58;
  ulong local_50;
  ulong local_48;
  UnifiedVectorFormat *local_40;
  ulong local_38;
  
  local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_e0 = result;
  local_d8 = rsel;
  local_a0 = sep_data;
  local_58 = sep_sel;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_78,args->count,(value_type_conflict *)&local_d0,(allocator_type *)&local_100);
  local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_d0,args->count,(bool *)&local_100,(allocator_type *)&local_128);
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar12 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar24 = (long)pVVar12 - (long)pVVar2 >> 3;
  uVar25 = lVar24 * 0x4ec4ec4ec4ec4ec5;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar25;
  uVar8 = SUB168(auVar5 * ZEXT816(0x48),0);
  uVar9 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x48),8) == 0) {
    uVar8 = uVar9;
  }
  puVar10 = (ulong *)operator_new__(uVar8);
  *puVar10 = uVar25;
  local_118 = (UnifiedVectorFormat *)(puVar10 + 1);
  pVVar16 = pVVar12;
  if (pVVar12 != pVVar2) {
    lVar26 = 0;
    pUVar14 = local_118;
    do {
      UnifiedVectorFormat::UnifiedVectorFormat(pUVar14);
      lVar26 = lVar26 + -0x48;
      pUVar14 = pUVar14 + 1;
    } while (-lVar26 != lVar24 * 0x2762762762762768);
    pVVar12 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pVVar16 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  local_a8 = args;
  if (1 < (ulong)(((long)pVVar12 - (long)pVVar16 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    __n_00 = 1;
    lVar24 = 0;
    do {
      this = vector<duckdb::Vector,_true>::operator[](&args->data,__n_00);
      Vector::ToUnifiedFormat
                (this,args->count,(UnifiedVectorFormat *)((long)&local_118->sel + lVar24));
      __n_00 = __n_00 + 1;
      pVVar16 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar12 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar8 = ((long)pVVar12 - (long)pVVar16 >> 3) * 0x4ec4ec4ec4ec4ec5;
      lVar24 = lVar24 + 0x48;
    } while (__n_00 < uVar8);
    if (1 < uVar8) {
      uVar8 = 1;
      local_88 = 0x800000000000003f;
      do {
        if (count != 0) {
          pUVar14 = local_118 + uVar8;
          local_120 = pUVar14[-1].data;
          uVar9 = 0;
          local_108 = pUVar14;
          local_90 = uVar8;
          do {
            uVar8 = uVar9;
            if (local_d8->sel_vector != (sel_t *)0x0) {
              uVar8 = (ulong)local_d8->sel_vector[uVar9];
            }
            uVar25 = uVar8;
            if (local_58->sel_vector != (sel_t *)0x0) {
              uVar25 = (ulong)local_58->sel_vector[uVar8];
            }
            psVar3 = (pUVar14[-1].sel)->sel_vector;
            uVar20 = uVar8;
            if (psVar3 != (sel_t *)0x0) {
              uVar20 = (ulong)psVar3[uVar8];
            }
            puVar4 = pUVar14[-1].validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) ||
               ((puVar4[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) {
              uVar22 = (ulong)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
              if (uVar22 <= uVar8) {
                pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                local_128 = 0x37;
                local_100._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create
                                        ((ulong *)&local_100,(ulong)&local_128);
                local_100.field_2._M_allocated_capacity = local_128;
                builtin_strncpy(local_100._M_dataplus._M_p,
                                "Attempted to access index %ld within vector of size %ld",0x37);
                local_100._M_string_length = local_128;
                local_100._M_dataplus._M_p[local_128] = '\0';
                InternalException::InternalException<unsigned_long,unsigned_long>
                          (pIVar13,&local_100,uVar8,uVar22);
                __cxa_throw(pIVar13,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              uVar22 = uVar8 + 0x3f;
              if (-1 < (long)uVar8) {
                uVar22 = uVar8;
              }
              uVar15 = (ulong)((uVar8 & local_88) < 0x8000000000000001);
              local_110 = 1L << ((byte)uVar8 & 0x3f);
              if ((local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar22 >> 6) + (uVar15 - 1)] >> (uVar8 & 0x3f) & 1) != 0) {
                uVar1 = local_a0[uVar25].value.pointer.length;
                pvVar11 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)&local_78,uVar8);
                *pvVar11 = *pvVar11 + (ulong)uVar1;
              }
              uVar1 = *(uint *)(local_120 + uVar20 * 0x10);
              pvVar11 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)&local_78,uVar8);
              *pvVar11 = *pvVar11 + (ulong)uVar1;
              uVar25 = (ulong)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
              if (uVar25 <= uVar8) {
                pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                local_128 = 0x37;
                local_100._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create
                                        ((ulong *)&local_100,(ulong)&local_128);
                local_100.field_2._M_allocated_capacity = local_128;
                builtin_strncpy(local_100._M_dataplus._M_p,
                                "Attempted to access index %ld within vector of size %ld",0x37);
                local_100._M_string_length = local_128;
                local_100._M_dataplus._M_p[local_128] = '\0';
                InternalException::InternalException<unsigned_long,unsigned_long>
                          (pIVar13,&local_100,uVar8,uVar25);
                __cxa_throw(pIVar13,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[((long)uVar22 >> 6) + (uVar15 - 1)] =
                   local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar22 >> 6) + (uVar15 - 1)] | local_110;
              pUVar14 = local_108;
            }
            uVar9 = uVar9 + 1;
          } while (count != uVar9);
          pVVar16 = (local_a8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pVVar12 = (local_a8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar8 = local_90;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(((long)pVVar12 - (long)pVVar16 >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
  }
  pdVar18 = local_e0->data;
  if (count != 0) {
    iVar17 = 0;
    do {
      __n = iVar17;
      if (local_d8->sel_vector != (sel_t *)0x0) {
        __n = (idx_t)local_d8->sel_vector[iVar17];
      }
      pvVar11 = vector<unsigned_long,_true>::operator[]
                          ((vector<unsigned_long,_true> *)&local_78,__n);
      sVar27 = StringVector::EmptyString((StringVector *)local_e0,(Vector *)*pvVar11,len);
      *(long *)(pdVar18 + __n * 0x10) = sVar27.value._0_8_;
      *(long *)(pdVar18 + __n * 0x10 + 8) = sVar27.value._8_8_;
      pvVar11 = vector<unsigned_long,_true>::operator[]
                          ((vector<unsigned_long,_true> *)&local_78,__n);
      *pvVar11 = 0;
      uVar8 = (ulong)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      if (uVar8 <= __n) {
        pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,"Attempted to access index %ld within vector of size %ld",""
                  );
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (pIVar13,&local_100,__n,uVar8);
        __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar8 = __n + 0x3f;
      if (-1 < (long)__n) {
        uVar8 = __n;
      }
      bVar6 = (byte)__n & 0x3f;
      local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar8 >> 6) + ((ulong)((__n & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar8 >> 6) + ((ulong)((__n & 0x800000000000003f) < 0x8000000000000001) - 1)] &
           (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      iVar17 = iVar17 + 1;
    } while (count != iVar17);
    pVVar16 = (local_a8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar12 = (local_a8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (1 < (ulong)(((long)pVVar12 - (long)pVVar16 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    uVar8 = 1;
    local_48 = 0x800000000000003f;
    local_98 = pdVar18;
    do {
      if (count != 0) {
        pUVar14 = local_118 + uVar8;
        pdVar18 = pUVar14[-1].data;
        uVar9 = 0;
        psVar21 = local_a0;
        local_60 = pdVar18;
        local_50 = uVar8;
        local_40 = pUVar14;
        do {
          pdVar23 = local_98;
          uVar8 = uVar9;
          if (local_d8->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)local_d8->sel_vector[uVar9];
          }
          uVar25 = uVar8;
          if (local_58->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)local_58->sel_vector[uVar8];
          }
          psVar3 = (pUVar14[-1].sel)->sel_vector;
          uVar20 = uVar8;
          if (psVar3 != (sel_t *)0x0) {
            uVar20 = (ulong)psVar3[uVar8];
          }
          puVar4 = pUVar14[-1].validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar4 == (unsigned_long *)0x0) ||
             ((puVar4[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) {
            uVar22 = (ulong)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
            if (uVar22 <= uVar8) {
              pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              local_128 = 0x37;
              local_100._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_128)
              ;
              local_100.field_2._M_allocated_capacity = local_128;
              builtin_strncpy(local_100._M_dataplus._M_p,
                              "Attempted to access index %ld within vector of size %ld",0x37);
              local_100._M_string_length = local_128;
              local_100._M_dataplus._M_p[local_128] = '\0';
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar13,&local_100,uVar8,uVar22);
              __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar22 = uVar8 + 0x3f;
            if (-1 < (long)uVar8) {
              uVar22 = uVar8;
            }
            local_e0 = (Vector *)((long)uVar22 >> 6);
            local_90 = (ulong)((uVar8 & local_48) < 0x8000000000000001);
            local_38 = 1L << ((byte)uVar8 & 0x3f);
            local_110 = uVar8;
            local_88 = uVar9;
            if ((local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)local_e0 + (local_90 - 1)] >> (uVar8 & 0x3f) & 1) != 0) {
              local_120 = (data_ptr_t)(ulong)psVar21[uVar25].value.pointer.length;
              local_108 = (UnifiedVectorFormat *)psVar21[uVar25].value.pointer.ptr;
              lVar24 = uVar8 * 0x10;
              local_7c = *(uint *)(local_98 + lVar24);
              pdVar18 = *(data_ptr_t *)(local_98 + lVar24 + 8);
              pvVar11 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)&local_78,uVar8);
              if (local_7c < 0xd) {
                pdVar18 = pdVar23 + lVar24 + 4;
              }
              pUVar14 = local_108;
              if ((uint)local_120 < 0xd) {
                pUVar14 = (UnifiedVectorFormat *)((long)&psVar21[uVar25].value + 4);
              }
              switchD_012b9b0d::default(pdVar18 + *pvVar11,pUVar14,(size_t)local_120);
              pvVar11 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)&local_78,local_110);
              *pvVar11 = *pvVar11 + (long)local_120;
              pdVar18 = local_60;
            }
            pdVar7 = local_98;
            lVar24 = uVar20 * 0x10;
            local_120 = (data_ptr_t)(ulong)*(uint *)(pdVar18 + lVar24);
            pdVar23 = *(data_ptr_t *)(pdVar18 + lVar24 + 8);
            lVar26 = local_110 * 0x10;
            local_108 = (UnifiedVectorFormat *)
                        CONCAT44(local_108._4_4_,*(undefined4 *)(local_98 + lVar26));
            pdVar19 = *(data_ptr_t *)(local_98 + lVar26 + 8);
            pvVar11 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)&local_78,local_110);
            if ((uint)local_108 < 0xd) {
              pdVar19 = pdVar7 + lVar26 + 4;
            }
            if ((uint)local_120 < 0xd) {
              pdVar23 = pdVar18 + lVar24 + 4;
            }
            switchD_012b9b0d::default(pdVar19 + *pvVar11,pdVar23,(size_t)local_120);
            pvVar11 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)&local_78,local_110);
            uVar9 = local_110;
            *pvVar11 = (value_type)(local_120 + *pvVar11);
            uVar8 = (ulong)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
            if (uVar8 <= local_110) {
              pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              local_128 = 0x37;
              local_100._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_128)
              ;
              local_100.field_2._M_allocated_capacity = local_128;
              builtin_strncpy(local_100._M_dataplus._M_p,
                              "Attempted to access index %ld within vector of size %ld",0x37);
              local_100._M_string_length = local_128;
              local_100._M_dataplus._M_p[local_128] = '\0';
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar13,&local_100,uVar9,uVar8);
              __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[(long)local_e0 + (local_90 - 1)] =
                 local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)local_e0 + (local_90 - 1)] | local_38;
            psVar21 = local_a0;
            pUVar14 = local_40;
            uVar9 = local_88;
            pdVar18 = local_60;
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
        pVVar16 = (local_a8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar12 = (local_a8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar8 = local_50;
        pdVar18 = local_98;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(((long)pVVar12 - (long)pVVar16 >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  if (count != 0) {
    uVar8 = 0;
    do {
      uVar9 = uVar8;
      if (local_d8->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)local_d8->sel_vector[uVar8];
      }
      lVar24 = uVar9 * 0x10;
      uVar9 = (ulong)*(uint *)(pdVar18 + lVar24);
      if (uVar9 < 0xd) {
        switchD_012e3010::default(pdVar18 + uVar9 + lVar24 + 4,0,0xc - uVar9);
      }
      else {
        *(undefined4 *)(pdVar18 + lVar24 + 4) = **(undefined4 **)(pdVar18 + lVar24 + 8);
      }
      uVar8 = uVar8 + 1;
    } while (count != uVar8);
  }
  if (local_118 != (UnifiedVectorFormat *)0x0) {
    ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&local_118,local_118);
  }
  if (local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void TemplatedConcatWS(DataChunk &args, const string_t *sep_data, const SelectionVector &sep_sel,
                              const SelectionVector &rsel, idx_t count, Vector &result) {
	vector<idx_t> result_lengths(args.size(), 0);
	vector<bool> has_results(args.size(), false);

	// we overallocate here, but this is important for static analysis
	auto orrified_data = make_unsafe_uniq_array_uninitialized<UnifiedVectorFormat>(args.ColumnCount());

	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		args.data[col_idx].ToUnifiedFormat(args.size(), orrified_data[col_idx - 1]);
	}

	// first figure out the lengths
	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		auto &idata = orrified_data[col_idx - 1];

		auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);
		for (idx_t i = 0; i < count; i++) {
			auto ridx = rsel.get_index(i);
			auto sep_idx = sep_sel.get_index(ridx);
			auto idx = idata.sel->get_index(ridx);
			if (!idata.validity.RowIsValid(idx)) {
				continue;
			}
			if (has_results[ridx]) {
				result_lengths[ridx] += sep_data[sep_idx].GetSize();
			}
			result_lengths[ridx] += input_data[idx].GetSize();
			has_results[ridx] = true;
		}
	}

	// first we allocate the empty strings for each of the values
	auto result_data = FlatVector::GetData<string_t>(result);
	for (idx_t i = 0; i < count; i++) {
		auto ridx = rsel.get_index(i);
		// allocate an empty string of the required size
		result_data[ridx] = StringVector::EmptyString(result, result_lengths[ridx]);
		// we reuse the result_lengths vector to store the currently appended size
		result_lengths[ridx] = 0;
		has_results[ridx] = false;
	}

	// now that the empty space for the strings has been allocated, perform the concatenation
	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		auto &idata = orrified_data[col_idx - 1];
		auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);
		for (idx_t i = 0; i < count; i++) {
			auto ridx = rsel.get_index(i);
			auto sep_idx = sep_sel.get_index(ridx);
			auto idx = idata.sel->get_index(ridx);
			if (!idata.validity.RowIsValid(idx)) {
				continue;
			}
			if (has_results[ridx]) {
				auto sep_size = sep_data[sep_idx].GetSize();
				auto sep_ptr = sep_data[sep_idx].GetData();
				memcpy(result_data[ridx].GetDataWriteable() + result_lengths[ridx], sep_ptr, sep_size);
				result_lengths[ridx] += sep_size;
			}
			auto input_ptr = input_data[idx].GetData();
			auto input_len = input_data[idx].GetSize();
			memcpy(result_data[ridx].GetDataWriteable() + result_lengths[ridx], input_ptr, input_len);
			result_lengths[ridx] += input_len;
			has_results[ridx] = true;
		}
	}
	for (idx_t i = 0; i < count; i++) {
		auto ridx = rsel.get_index(i);
		result_data[ridx].Finalize();
	}
}